

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::CopyFileTime(char *fromFile,char *toFile)

{
  int iVar1;
  bool bVar2;
  utimbuf buf;
  stat fromStat;
  utimbuf local_a8;
  stat64 local_98;
  
  iVar1 = stat64(fromFile,&local_98);
  if (iVar1 < 0) {
    bVar2 = false;
  }
  else {
    local_a8.actime = local_98.st_atim.tv_sec;
    local_a8.modtime = local_98.st_mtim.tv_sec;
    iVar1 = utime(toFile,&local_a8);
    bVar2 = -1 < iVar1;
  }
  return bVar2;
}

Assistant:

bool cmSystemTools::CopyFileTime(const char* fromFile, const char* toFile)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  cmSystemToolsWindowsHandle hFrom =
    CreateFileW(cmsys::Encoding::ToWide(fromFile).c_str(),
                GENERIC_READ, FILE_SHARE_READ, 0,
                OPEN_EXISTING, 0, 0);
  cmSystemToolsWindowsHandle hTo =
    CreateFileW(cmsys::Encoding::ToWide(toFile).c_str(),
                GENERIC_WRITE, 0, 0, OPEN_EXISTING, 0, 0);
  if(!hFrom || !hTo)
    {
    return false;
    }
  FILETIME timeCreation;
  FILETIME timeLastAccess;
  FILETIME timeLastWrite;
  if(!GetFileTime(hFrom, &timeCreation, &timeLastAccess, &timeLastWrite))
    {
    return false;
    }
  if(!SetFileTime(hTo, &timeCreation, &timeLastAccess, &timeLastWrite))
    {
    return false;
    }
#else
  struct stat fromStat;
  if(stat(fromFile, &fromStat) < 0)
    {
    return false;
    }

  struct utimbuf buf;
  buf.actime = fromStat.st_atime;
  buf.modtime = fromStat.st_mtime;
  if(utime(toFile, &buf) < 0)
    {
    return false;
    }
#endif
  return true;
}